

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O3

void __thiscall YdiskRestClient::cleanTrash(YdiskRestClient *this)

{
  YdiskRestClient *this_00;
  shared_ptr<httplib::Response> r;
  string url;
  undefined1 local_48 [16];
  Headers *local_38;
  undefined8 local_28;
  
  this_00 = (YdiskRestClient *)local_48;
  local_38 = (Headers *)&stack0xffffffffffffffd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/v1/disk/trash/resources","")
  ;
  httplib::Client::Delete((Client *)local_48,(char *)this->http_client,local_38);
  if ((Response *)local_48._0_8_ == (Response *)0x0) {
LAB_00140f09:
    throw_response_error(this_00,(Response *)local_48._0_8_);
  }
  else if (*(int *)(local_48._0_8_ + 0x20) != 0xca) {
    if (*(int *)(local_48._0_8_ + 0x20) == 0xcc) goto LAB_00140f1a;
    goto LAB_00140f09;
  }
  wait_success_operation(this,&((Response *)local_48._0_8_)->body);
LAB_00140f1a:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if (local_38 != (Headers *)&stack0xffffffffffffffd8) {
    operator_delete(local_38,local_28 + 1);
  }
  return;
}

Assistant:

void YdiskRestClient::cleanTrash()
{
    std::string url("/v1/disk/trash/resources");
    auto r = http_client->Delete(url.c_str(), headers);

    if(r.get() && r->status==204){
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is removing, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}